

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify.c++
# Opt level: O0

StringTree * capnp::prettyPrint(Builder value)

{
  Reader value_00;
  StringTree *in_RDI;
  undefined8 in_stack_ffffffffffffffa0;
  Reader local_48;
  
  DynamicStruct::Builder::asReader(&local_48,(Builder *)&stack0x00000008);
  value_00.reader.segment = (SegmentReader *)local_48.reader.capTable;
  value_00.schema.super_Schema.raw = (Schema)(Schema)local_48.reader.segment;
  value_00.reader.capTable = (CapTableReader *)local_48.reader.data;
  value_00.reader.data = local_48.reader.pointers;
  value_00.reader.pointers = (WirePointer *)local_48.reader._32_8_;
  value_00.reader.dataSize = local_48.reader.nestingLimit;
  value_00.reader.pointerCount = local_48.reader._44_2_;
  value_00.reader._38_2_ = local_48.reader._46_2_;
  value_00.reader._40_8_ = in_stack_ffffffffffffffa0;
  prettyPrint(value_00);
  return in_RDI;
}

Assistant:

kj::StringTree prettyPrint(DynamicStruct::Builder value) { return prettyPrint(value.asReader()); }